

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotest.cpp
# Opt level: O2

void Test::showFinalResult(void)

{
  ostream *poVar1;
  ostream *this;
  char *pcVar2;
  
  if (failedNum == 0) {
    this = (ostream *)std::operator<<((ostream *)&std::cout,"All ");
    pcVar2 = " tests passed!";
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Failed in ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,failedNum);
    this = (ostream *)std::operator<<(poVar1," out of ");
    pcVar2 = " tests!";
  }
  poVar1 = (ostream *)std::ostream::operator<<(this,totalNum);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Test::showFinalResult() {
    if (!failedNum) {
        std::cout << "All " << totalNum << " tests passed!" << std::endl;
    } else {
        std::cout << "Failed in " << failedNum << " out of " << totalNum << " tests!" << std::endl;
    }
}